

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.h
# Opt level: O2

String * __thiscall
kj::_::
concat<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
          (String *__return_storage_ptr__,_ *this,ArrayPtr<const_char> *params,
          ArrayPtr<const_char> *params_1,CappedArray<char,_14UL> *params_2,
          FixedArray<char,_1UL> *params_3,CappedArray<char,_14UL> *params_4,
          FixedArray<char,_1UL> *params_5,ArrayPtr<const_char> *params_6,
          ArrayPtr<const_char> *params_7)

{
  size_t size;
  char *target;
  initializer_list<unsigned_long> nums;
  undefined8 local_70;
  size_t local_68;
  char *local_60;
  undefined8 local_58;
  undefined8 local_50;
  undefined8 local_48;
  undefined8 local_40;
  size_t local_38;
  
  local_70 = *(undefined8 *)(this + 8);
  local_68 = params->size_;
  local_60 = params_1->ptr;
  local_58 = 1;
  local_50 = *(undefined8 *)params_3;
  local_48 = 1;
  local_40 = *(undefined8 *)(params_5 + 8);
  local_38 = params_6->size_;
  nums._M_len = (size_type)params_5;
  nums._M_array = (iterator)0x8;
  size = sum((_ *)&local_70,nums);
  heapString(__return_storage_ptr__,size);
  target = (char *)(__return_storage_ptr__->content).size_;
  if (target != (char *)0x0) {
    target = (__return_storage_ptr__->content).ptr;
  }
  fill<kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::CappedArray<char,14ul>,kj::FixedArray<char,1ul>,kj::ArrayPtr<char_const>,kj::ArrayPtr<char_const>>
            (target,(ArrayPtr<const_char> *)this,params,(CappedArray<char,_14UL> *)params_1,
             (FixedArray<char,_1UL> *)params_2,(CappedArray<char,_14UL> *)params_3,
             (FixedArray<char,_1UL> *)params_4,(ArrayPtr<const_char> *)params_5,params_6);
  return __return_storage_ptr__;
}

Assistant:

String concat(Params&&... params) {
  // Concatenate a bunch of containers into a single Array.  The containers can be anything that
  // is iterable and whose elements can be converted to `char`.

  String result = heapString(sum({params.size()...}));
  fill(result.begin(), kj::fwd<Params>(params)...);
  return result;
}